

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSwitch.c
# Opt level: O0

Vec_Int_t * Sim_NtkComputeSwitching(Abc_Ntk_t *pNtk,int nPatterns)

{
  int *piVar1;
  int nWords;
  int iVar2;
  Vec_Ptr_t *p;
  Vec_Int_t *pVVar3;
  Abc_Obj_t *pAVar4;
  Vec_Ptr_t *p_00;
  uint *puVar5;
  float fVar6;
  int local_50;
  int i;
  int nSimWords;
  uint *pSimInfo;
  Abc_Obj_t *pNode;
  Vec_Ptr_t *vSimInfo;
  Vec_Ptr_t *vNodes;
  float *pSwitching;
  Vec_Int_t *vSwitching;
  int nPatterns_local;
  Abc_Ntk_t *pNtk_local;
  
  nWords = (nPatterns >> 5) + (uint)((nPatterns & 0x1fU) != 0);
  iVar2 = Abc_NtkObjNumMax(pNtk);
  p = Sim_UtilInfoAlloc(iVar2,nWords,0);
  iVar2 = Abc_NtkObjNumMax(pNtk);
  pVVar3 = Vec_IntStart(iVar2);
  piVar1 = pVVar3->pArray;
  for (local_50 = 0; iVar2 = Abc_NtkCiNum(pNtk), local_50 < iVar2; local_50 = local_50 + 1) {
    pAVar4 = Abc_NtkCi(pNtk,local_50);
    puVar5 = (uint *)Vec_PtrEntry(p,pAVar4->Id);
    Sim_UtilSetRandom(puVar5,nWords);
    fVar6 = Sim_ComputeSwitching(puVar5,nWords);
    piVar1[pAVar4->Id] = (int)fVar6;
  }
  p_00 = Abc_AigDfs(pNtk,1,0);
  for (local_50 = 0; iVar2 = Vec_PtrSize(p_00), local_50 < iVar2; local_50 = local_50 + 1) {
    pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(p_00,local_50);
    puVar5 = (uint *)Vec_PtrEntry(p,pAVar4->Id);
    Sim_UtilSimulateNodeOne(pAVar4,p,nWords,0);
    fVar6 = Sim_ComputeSwitching(puVar5,nWords);
    piVar1[pAVar4->Id] = (int)fVar6;
  }
  Vec_PtrFree(p_00);
  Sim_UtilInfoFree(p);
  return pVVar3;
}

Assistant:

Vec_Int_t * Sim_NtkComputeSwitching( Abc_Ntk_t * pNtk, int nPatterns )
{
    Vec_Int_t * vSwitching;
    float * pSwitching;
    Vec_Ptr_t * vNodes;
    Vec_Ptr_t * vSimInfo;
    Abc_Obj_t * pNode;
    unsigned * pSimInfo;
    int nSimWords, i;

    // allocate space for simulation info of all nodes
    nSimWords = SIM_NUM_WORDS(nPatterns);
    vSimInfo = Sim_UtilInfoAlloc( Abc_NtkObjNumMax(pNtk), nSimWords, 0 );
    // assign the random simulation to the CIs
    vSwitching = Vec_IntStart( Abc_NtkObjNumMax(pNtk) );
    pSwitching = (float *)vSwitching->pArray;
    Abc_NtkForEachCi( pNtk, pNode, i )
    {
        pSimInfo = (unsigned *)Vec_PtrEntry(vSimInfo, pNode->Id);
        Sim_UtilSetRandom( pSimInfo, nSimWords );
        pSwitching[pNode->Id] = Sim_ComputeSwitching( pSimInfo, nSimWords );
    }
    // simulate the internal nodes
    vNodes  = Abc_AigDfs( pNtk, 1, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        pSimInfo = (unsigned *)Vec_PtrEntry(vSimInfo, pNode->Id);
        Sim_UtilSimulateNodeOne( pNode, vSimInfo, nSimWords, 0 );
        pSwitching[pNode->Id] = Sim_ComputeSwitching( pSimInfo, nSimWords );
    }
    Vec_PtrFree( vNodes );
    Sim_UtilInfoFree( vSimInfo );
    return vSwitching;
}